

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

void qt_QMetaEnum_flagDebugOperator<unsigned_long_long>
               (QDebug *debug,size_t sizeofT,unsigned_long_long value)

{
  storage_type *in_RCX;
  bool bVar1;
  Stream *pSVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDebugStateSaver saver;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_58,debug);
  QTextStream::reset(&debug->stream->ts);
  pSVar2 = debug->stream;
  pSVar2->verbosity = 2;
  pSVar2->space = false;
  pSVar2->noQuotes = false;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QFlags(";
  QString::fromUtf8(&local_50,(QString *)&DAT_00000007,ba);
  QTextStream::operator<<(&pSVar2->ts,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pSVar2 = debug->stream;
  if (pSVar2->space == true) {
    QTextStream::operator<<(&pSVar2->ts,' ');
    pSVar2 = debug->stream;
  }
  Qt::hex(&pSVar2->ts);
  Qt::showbase(&debug->stream->ts);
  if (sizeofT << 3 != 0) {
    uVar3 = 0;
    bVar1 = false;
    do {
      if ((value >> (uVar3 & 0x3f) & 1) != 0) {
        pSVar2 = debug->stream;
        if (bVar1) {
          QTextStream::operator<<(&pSVar2->ts,'|');
          pSVar2 = debug->stream;
          if (pSVar2->space == true) {
            QTextStream::operator<<(&pSVar2->ts,' ');
            pSVar2 = debug->stream;
          }
        }
        QTextStream::operator<<(&pSVar2->ts,1L << ((byte)uVar3 & 0x3f));
        bVar1 = true;
        if (debug->stream->space == true) {
          QTextStream::operator<<(&debug->stream->ts,' ');
        }
      }
      uVar3 = uVar3 + 1;
    } while (sizeofT << 3 != uVar3);
  }
  QTextStream::operator<<(&debug->stream->ts,')');
  if (debug->stream->space == true) {
    QTextStream::operator<<(&debug->stream->ts,' ');
  }
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_QMetaEnum_flagDebugOperator(QDebug &debug, size_t sizeofT, Int value)
{
    static_assert(std::is_unsigned_v<Int>,
            "Cast value to an unsigned type before calling this function");
    const QDebugStateSaver saver(debug);
    debug.resetFormat();
    debug.nospace() << "QFlags(" << Qt::hex << Qt::showbase;
    bool needSeparator = false;
    for (size_t i = 0; i < sizeofT * 8; ++i) {
        if (value & (Int(1) << i)) {
            if (needSeparator)
                debug << '|';
            else
                needSeparator = true;
            debug << (Int(1) << i);
        }
    }
    debug << ')';
}